

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

void __thiscall
cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::
Object(Object<(anonymous_namespace)::Version> *this,Object<(anonymous_namespace)::Version> *param_1)

{
  pointer pMVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined3 uVar4;
  ReadFileResult RVar5;
  pointer pMVar6;
  long lVar7;
  pointer pMVar8;
  
  lVar7 = (long)(param_1->Members).
                super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(param_1->Members).
                super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar6 = std::
           _Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
           ::_M_allocate((_Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
                          *)(lVar7 / 0x38),(size_t)param_1);
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
  ._M_impl.super__Vector_impl_data._M_start = pMVar6;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMVar6;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar7 + (long)pMVar6);
  pMVar1 = (param_1->Members).
           super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar8 = (param_1->Members).
                super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar8 != pMVar1; pMVar8 = pMVar8 + 1) {
    pcVar3 = (pMVar8->Name)._M_str;
    (pMVar6->Name)._M_len = (pMVar8->Name)._M_len;
    (pMVar6->Name)._M_str = pcVar3;
    std::
    function<cmCTestResourceSpec::ReadFileResult_((anonymous_namespace)::Version_&,_const_Json::Value_*)>
    ::function(&pMVar6->Function,&pMVar8->Function);
    pMVar6->Required = pMVar8->Required;
    pMVar6 = pMVar6 + 1;
  }
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMVar6;
  uVar4 = *(undefined3 *)&param_1->field_0x19;
  RVar5 = param_1->Success;
  uVar2 = *(undefined8 *)((long)&param_1->Success + 1);
  this->AnyRequired = param_1->AnyRequired;
  *(undefined3 *)&this->field_0x19 = uVar4;
  this->Success = RVar5;
  *(undefined8 *)((long)&this->Success + 1) = uVar2;
  return;
}

Assistant:

Object(E&& success, E&& fail, bool allowExtra = true)
      : Success(std::move(success))
      , Fail(std::move(fail))
      , AllowExtra(allowExtra)
    {
    }